

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::PortSymbol::serializeTo(PortSymbol *this,ASTSerializer *serializer)

{
  Type *__n;
  size_t __n_00;
  Expression *__n_01;
  string_view name;
  
  __n = getType(this);
  ASTSerializer::write(serializer,4,"type",(size_t)__n);
  __n_00 = strlen(*(char **)(toString(slang::ast::ArgumentDirection)::strings +
                            (long)(int)this->direction * 8));
  ASTSerializer::write(serializer,9,"direction",__n_00);
  if (this->isNullPort == true) {
    ASTSerializer::write(serializer,10,"isNullPort",1);
  }
  __n_01 = getInitializer(this);
  if (__n_01 != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xb,"initializer",(size_t)__n_01);
  }
  if (this->internalSymbol != (Symbol *)0x0) {
    name._M_str = "internalSymbol";
    name._M_len = 0xe;
    ASTSerializer::writeLink(serializer,name,this->internalSymbol);
    return;
  }
  return;
}

Assistant:

void PortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("type", getType());
    serializer.write("direction", toString(direction));

    if (isNullPort)
        serializer.write("isNullPort", isNullPort);

    if (auto init = getInitializer())
        serializer.write("initializer", *init);

    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
}